

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O3

void printf_btr_ti_hecc(can_bittiming *bt,_Bool hdr)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,hdr) != 0) {
    printf("%10s","CANBTC");
    return;
  }
  printf("0x%08x",(ulong)(bt->brp * 0x10000 + 0xff0000 & 0xff0000 |
                         bt->sjw * 0x100 + 0x300 & 0x300 |
                         (bt->prop_seg + bt->phase_seg1) * 8 + 0x78 & 0x78 | bt->phase_seg2 - 1 & 7)
        );
  return;
}

Assistant:

static void printf_btr_ti_hecc(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "CANBTC");
	} else {
		uint32_t can_btc;

		can_btc = (bt->phase_seg2 - 1) & 0x7;
		can_btc |= ((bt->phase_seg1 + bt->prop_seg - 1)
			    & 0xF) << 3;
		can_btc |= ((bt->sjw - 1) & 0x3) << 8;
		can_btc |= ((bt->brp - 1) & 0xFF) << 16;

		printf("0x%08x", can_btc);
	}
}